

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

int64_t __thiscall mkvmuxer::Segment::MaxOffset(Segment *this)

{
  Cluster *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  uint64 uVar3;
  undefined4 extraout_var_00;
  long lVar4;
  long lVar5;
  
  if (this->writer_header_ == (IMkvWriter *)0x0) {
    lVar5 = -1;
  }
  else {
    iVar2 = (*this->writer_header_->_vptr_IMkvWriter[1])();
    lVar5 = CONCAT44(extraout_var,iVar2) - this->payload_pos_;
    if (this->chunking_ == true) {
      if (0 < this->cluster_list_size_) {
        lVar4 = 0;
        do {
          pCVar1 = this->cluster_list_[lVar4];
          uVar3 = EbmlMasterElementSize(0x1f43b675,0xffffffffffffffff);
          lVar5 = uVar3 + lVar5 + pCVar1->payload_size_;
          lVar4 = lVar4 + 1;
        } while (lVar4 < this->cluster_list_size_);
      }
      if (this->writer_cues_ != (IMkvWriter *)0x0) {
        iVar2 = (*this->writer_cues_->_vptr_IMkvWriter[1])();
        lVar5 = CONCAT44(extraout_var_00,iVar2) + lVar5;
      }
    }
  }
  return lVar5;
}

Assistant:

int64_t Segment::MaxOffset() {
  if (!writer_header_)
    return -1;

  int64_t offset = writer_header_->Position() - payload_pos_;

  if (chunking_) {
    for (int32_t i = 0; i < cluster_list_size_; ++i) {
      Cluster* const cluster = cluster_list_[i];
      offset += cluster->Size();
    }

    if (writer_cues_)
      offset += writer_cues_->Position();
  }

  return offset;
}